

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O1

Diagnostics * __thiscall slang::ast::Compilation::getSemanticDiagnostics(Compilation *this)

{
  SmallVectorBase<slang::Diagnostic> *ctx;
  SmallVectorBase<slang::Diagnostic> local_110;
  
  if ((this->cachedSemanticDiagnostics).super__Optional_base<slang::Diagnostics,_false,_false>.
      _M_payload.super__Optional_payload<slang::Diagnostics,_true,_false,_false>.
      super__Optional_payload_base<slang::Diagnostics>._M_engaged == false) {
    elaborate(this);
    ASTDiagMap::coalesce((Diagnostics *)&local_110,&this->diagMap,this->sourceManager);
    ctx = &local_110;
    std::optional<slang::Diagnostics>::emplace<slang::Diagnostics>
              (&this->cachedSemanticDiagnostics,(Diagnostics *)&local_110);
    SmallVectorBase<slang::Diagnostic>::cleanup(&local_110,(EVP_PKEY_CTX *)ctx);
  }
  return (Diagnostics *)&this->cachedSemanticDiagnostics;
}

Assistant:

const Diagnostics& Compilation::getSemanticDiagnostics() {
    if (cachedSemanticDiagnostics)
        return *cachedSemanticDiagnostics;

    // Elaborate the design.
    elaborate();

    cachedSemanticDiagnostics.emplace(diagMap.coalesce(sourceManager));
    return *cachedSemanticDiagnostics;
}